

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O0

size_t green_poller_used(green_poller_t poller)

{
  green_poller_t poller_local;
  
  if (poller == (green_poller_t)0x0) {
    poller_local = (green_poller_t)0x0;
  }
  else {
    if (poller->loop == (green_loop_t_conflict)0x0) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","poller->loop != ((void*)0)",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x197);
      fflush(_stderr);
      abort();
    }
    if (poller->size < poller->used) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","poller->size >= poller->used",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x198);
      fflush(_stderr);
      abort();
    }
    if (poller->used < poller->busy) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","poller->used >= poller->busy",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x199);
      fflush(_stderr);
      abort();
    }
    poller_local = (green_poller_t)poller->used;
  }
  return (size_t)poller_local;
}

Assistant:

size_t green_poller_used(green_poller_t poller)
{
    if (poller == NULL) {
        return 0;
    }
    green_assert(poller->loop != NULL);
    green_assert(poller->size >= poller->used);
    green_assert(poller->used >= poller->busy);
    return poller->used;
}